

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionManager.cpp
# Opt level: O0

CK_RV __thiscall SessionManager::closeSession(SessionManager *this,CK_SESSION_HANDLE hSession)

{
  bool bVar1;
  size_type sVar2;
  reference ppSVar3;
  Slot *pSVar4;
  CK_SLOT_ID CVar5;
  size_type sVar6;
  CK_SLOT_ID CVar7;
  ulong in_RSI;
  long in_RDI;
  size_t i;
  CK_SLOT_ID slotID;
  bool lastSession;
  unsigned_long sessionID;
  MutexLocker lock;
  Mutex *in_stack_ffffffffffffff48;
  value_type in_stack_ffffffffffffff50;
  Token *in_stack_ffffffffffffff70;
  ulong local_60;
  CK_RV local_8;
  
  if (in_RSI == 0) {
    local_8 = 0xb3;
  }
  else {
    MutexLocker::MutexLocker((MutexLocker *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    sVar2 = std::vector<Session_*,_std::allocator<Session_*>_>::size
                      ((vector<Session_*,_std::allocator<Session_*>_> *)(in_RDI + 8));
    if (sVar2 < in_RSI) {
      local_8 = 0xb3;
    }
    else {
      sVar2 = in_RSI - 1;
      ppSVar3 = std::vector<Session_*,_std::allocator<Session_*>_>::operator[]
                          ((vector<Session_*,_std::allocator<Session_*>_> *)(in_RDI + 8),sVar2);
      if (*ppSVar3 == (value_type)0x0) {
        local_8 = 0xb3;
      }
      else {
        bVar1 = true;
        ppSVar3 = std::vector<Session_*,_std::allocator<Session_*>_>::operator[]
                            ((vector<Session_*,_std::allocator<Session_*>_> *)(in_RDI + 8),sVar2);
        pSVar4 = Session::getSlot(*ppSVar3);
        CVar5 = Slot::getSlotID(pSVar4);
        for (local_60 = 0;
            sVar6 = std::vector<Session_*,_std::allocator<Session_*>_>::size
                              ((vector<Session_*,_std::allocator<Session_*>_> *)(in_RDI + 8)),
            local_60 < sVar6; local_60 = local_60 + 1) {
          ppSVar3 = std::vector<Session_*,_std::allocator<Session_*>_>::operator[]
                              ((vector<Session_*,_std::allocator<Session_*>_> *)(in_RDI + 8),
                               local_60);
          if (*ppSVar3 != (value_type)0x0) {
            ppSVar3 = std::vector<Session_*,_std::allocator<Session_*>_>::operator[]
                                ((vector<Session_*,_std::allocator<Session_*>_> *)(in_RDI + 8),
                                 local_60);
            in_stack_ffffffffffffff70 = (Token *)Session::getSlot(*ppSVar3);
            CVar7 = Slot::getSlotID((Slot *)in_stack_ffffffffffffff70);
            if ((CVar7 == CVar5) && (local_60 != sVar2)) {
              bVar1 = false;
              break;
            }
          }
        }
        if (bVar1) {
          ppSVar3 = std::vector<Session_*,_std::allocator<Session_*>_>::operator[]
                              ((vector<Session_*,_std::allocator<Session_*>_> *)(in_RDI + 8),sVar2);
          pSVar4 = Session::getSlot(*ppSVar3);
          Slot::getToken(pSVar4);
          Token::logout(in_stack_ffffffffffffff70);
        }
        ppSVar3 = std::vector<Session_*,_std::allocator<Session_*>_>::operator[]
                            ((vector<Session_*,_std::allocator<Session_*>_> *)(in_RDI + 8),sVar2);
        in_stack_ffffffffffffff50 = *ppSVar3;
        if (in_stack_ffffffffffffff50 != (value_type)0x0) {
          (*in_stack_ffffffffffffff50->_vptr_Session[1])();
        }
        ppSVar3 = std::vector<Session_*,_std::allocator<Session_*>_>::operator[]
                            ((vector<Session_*,_std::allocator<Session_*>_> *)(in_RDI + 8),sVar2);
        *ppSVar3 = (value_type)0x0;
        local_8 = 0;
      }
    }
    MutexLocker::~MutexLocker((MutexLocker *)in_stack_ffffffffffffff50);
  }
  return local_8;
}

Assistant:

CK_RV SessionManager::closeSession(CK_SESSION_HANDLE hSession)
{
	if (hSession == CK_INVALID_HANDLE) return CKR_SESSION_HANDLE_INVALID;

	// Lock access to the vector
	MutexLocker lock(sessionsMutex);

	// Check if we are out of range
	if (hSession > sessions.size()) return CKR_SESSION_HANDLE_INVALID;

	// Check if it is a closed session
	unsigned long sessionID = hSession - 1;
	if (sessions[sessionID] == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if this is the last session on the token
	bool lastSession = true;
	const CK_SLOT_ID slotID( sessions[sessionID]->getSlot()->getSlotID() );
	for (size_t i = 0; i < sessions.size(); i++)
	{
		if (sessions[i] == NULL) continue;

		if (sessions[i]->getSlot()->getSlotID() == slotID && i != sessionID)
		{
			lastSession = false;
			break;
		}
	}

	// Logout if this is the last session on the token
	if (lastSession)
	{
		sessions[sessionID]->getSlot()->getToken()->logout();
	}

	// Close the session
	delete sessions[sessionID];
	sessions[sessionID] = NULL;

	return CKR_OK;
}